

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseRunner.hpp
# Opt level: O0

void * Centaurus::BaseRunner::thread_runner<Centaurus::Stage1Runner>(void *param)

{
  void *param_local;
  
  Stage1Runner::thread_runner_impl((Stage1Runner *)param);
  return (void *)0x0;
}

Assistant:

static void *thread_runner(void *param)
#endif
  {
    reinterpret_cast<RunnerImpl*>(param)->thread_runner_impl();
#if defined(CENTAURUS_BUILD_WINDOWS)
    ExitThread(0);
#elif defined(CENTAURUS_BUILD_LINUX)
    return nullptr;
#endif
  }